

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O0

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
::advance(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
          *this,Cycles cycles)

{
  VideoBusHandler *this_00;
  uint16_t address;
  bool bVar1;
  int iVar2;
  GraphicsMode m;
  IntType IVar3;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  uint8_t *puVar7;
  byte *pbVar8;
  bool local_a1;
  int local_94 [2];
  undefined1 local_89;
  int local_88;
  int iStack_84;
  uint8_t phase;
  int local_80;
  int colour_burst_end;
  int local_78;
  int colour_burst_start;
  int second_blank_start;
  int iStack_6c;
  bool is_double;
  int pixel_row;
  int local_64;
  int pixel_end;
  short local_5c;
  uint16_t local_5a;
  int pixel_start;
  uint16_t text_address;
  uint16_t fetch_address;
  short local_4e;
  int fetch_end;
  GraphicsMode GStack_48;
  uint16_t row_address;
  int character_row;
  GraphicsMode line_mode;
  int blank_end;
  bool local_35;
  int blank_start;
  int iStack_30;
  bool is_vertical_sync_line;
  int ending_column;
  int local_28;
  int cycles_this_line;
  int int_cycles;
  int sync_length;
  int first_sync_column;
  int first_sync_line;
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
  *this_local;
  Cycles cycles_local;
  
  sync_length = 0xdc;
  int_cycles = 0x31;
  cycles_this_line = 4;
  _first_sync_column = this;
  this_local = (Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
                *)cycles.super_WrappedInt<Cycles>.length_;
  IVar3 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  local_28 = (int)IVar3;
  while (local_28 != 0) {
    iStack_30 = 0x41 - (this->super_VideoBase).column_;
    piVar4 = std::min<int>(&stack0xffffffffffffffd0,&local_28);
    ending_column = *piVar4;
    blank_start = (this->super_VideoBase).column_ + ending_column;
    local_a1 = false;
    if (0xdb < (this->super_VideoBase).row_) {
      local_a1 = (this->super_VideoBase).row_ < 0xdf;
    }
    local_35 = local_a1;
    if (local_a1 == false) {
      GStack_48 = VideoSwitches<Cycles>::graphics_mode
                            ((VideoSwitches<Cycles> *)this,(this->super_VideoBase).row_);
      if (((this->super_VideoBase).row_ < 0xc0) && ((this->super_VideoBase).column_ < 0x28)) {
        fetch_end = (this->super_VideoBase).row_ >> 3;
        local_4e = (short)((fetch_end & 7U) << 7) + (short)((uint)fetch_end >> 3) * 0x28;
        pixel_start = 0x28;
        piVar4 = std::min<int>(&pixel_start,&blank_start);
        _text_address = *piVar4;
        if ((GStack_48 < HighRes) || (1 < GStack_48 - HighRes)) {
          iVar2 = VideoSwitches<Cycles>::video_page((VideoSwitches<Cycles> *)this);
          local_5c = ((short)iVar2 + 1) * 0x400 + local_4e;
          local_5a = local_5c + (short)(this->super_VideoBase).column_;
        }
        else {
          iVar2 = VideoSwitches<Cycles>::video_page((VideoSwitches<Cycles> *)this);
          local_5a = ((short)iVar2 + 1) * 0x2000 + local_4e +
                     (short)(((this->super_VideoBase).row_ & 7U) << 10) +
                     (short)(this->super_VideoBase).column_;
        }
        address = local_5a;
        this_00 = this->bus_handler_;
        iVar2 = _text_address - (this->super_VideoBase).column_;
        pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                           (&(this->super_VideoBase).base_stream_,
                            (long)(this->super_VideoBase).column_);
        pvVar6 = std::array<unsigned_char,_40UL>::operator[]
                           (&(this->super_VideoBase).auxiliary_stream_,
                            (long)(this->super_VideoBase).column_);
        ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler::
        perform_read(this_00,address,(long)iVar2,pvVar5,pvVar6);
      }
      if ((this->super_VideoBase).row_ < 0xc0) {
        if ((this->super_VideoBase).column_ == 0) {
          puVar7 = Outputs::CRT::CRT::begin_data(&(this->super_VideoBase).crt_,0x238,1);
          (this->super_VideoBase).pixel_pointer_ = puVar7;
          (this->super_VideoBase).graphics_carry_ = '\0';
          (this->super_VideoBase).was_double_ = true;
        }
        if ((this->super_VideoBase).column_ < 0x28) {
          local_64 = 0;
          piVar4 = std::max<int>(&local_64,&(this->super_VideoBase).column_);
          pixel_end = *piVar4;
          iStack_6c = 0x28;
          piVar4 = std::min<int>(&stack0xffffffffffffff94,&blank_start);
          pixel_row = *piVar4;
          second_blank_start = (this->super_VideoBase).row_ & 7;
          colour_burst_start._3_1_ = is_double_mode(GStack_48);
          if (((!(bool)colour_burst_start._3_1_) &&
              (((this->super_VideoBase).was_double_ & 1U) != 0)) &&
             ((this->super_VideoBase).pixel_pointer_ != (uint8_t *)0x0)) {
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 6] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 5] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 4] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 3] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 2] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe + 1] = '\0';
            (this->super_VideoBase).pixel_pointer_[pixel_end * 0xe] = '\0';
          }
          (this->super_VideoBase).was_double_ = (bool)colour_burst_start._3_1_;
          if ((this->super_VideoBase).pixel_pointer_ != (uint8_t *)0x0) {
            switch(GStack_48) {
            case Text:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              VideoBase::output_text
                        (&this->super_VideoBase,puVar7 + (iVar2 + 7),pvVar5,
                         (long)(pixel_row - pixel_end),(long)second_blank_start);
              break;
            case DoubleText:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              pvVar6 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).auxiliary_stream_,(long)pixel_end);
              VideoBase::output_double_text
                        (&this->super_VideoBase,puVar7 + iVar2,pvVar5,pvVar6,
                         (long)(pixel_row - pixel_end),(long)second_blank_start);
              break;
            case HighRes:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              VideoBase::output_high_resolution
                        (&this->super_VideoBase,puVar7 + (iVar2 + 7),pvVar5,
                         (long)(pixel_row - pixel_end));
              break;
            case DoubleHighRes:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              pvVar6 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).auxiliary_stream_,(long)pixel_end);
              VideoBase::output_double_high_resolution
                        (&this->super_VideoBase,puVar7 + iVar2,pvVar5,pvVar6,
                         (long)(pixel_row - pixel_end));
              break;
            case LowRes:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              VideoBase::output_low_resolution
                        (&this->super_VideoBase,puVar7 + (iVar2 + 7),pvVar5,
                         (long)(pixel_row - pixel_end),pixel_end,second_blank_start);
              break;
            case DoubleLowRes:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              pvVar6 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).auxiliary_stream_,(long)pixel_end);
              VideoBase::output_double_low_resolution
                        (&this->super_VideoBase,puVar7 + iVar2,pvVar5,pvVar6,
                         (long)(pixel_row - pixel_end),pixel_end,second_blank_start);
              break;
            case FatLowRes:
              puVar7 = (this->super_VideoBase).pixel_pointer_;
              iVar2 = pixel_end * 0xe;
              pvVar5 = std::array<unsigned_char,_40UL>::operator[]
                                 (&(this->super_VideoBase).base_stream_,(long)pixel_end);
              VideoBase::output_fat_low_resolution
                        (&this->super_VideoBase,puVar7 + (iVar2 + 7),pvVar5,
                         (long)(pixel_row - pixel_end),pixel_end,second_blank_start);
            }
          }
          if (pixel_row == 0x28) {
            if ((this->super_VideoBase).pixel_pointer_ != (uint8_t *)0x0) {
              if (((this->super_VideoBase).was_double_ & 1U) == 0) {
                if ((GStack_48 == HighRes) &&
                   (pbVar8 = std::array<unsigned_char,_40UL>::operator[]
                                       (&(this->super_VideoBase).base_stream_,0x27),
                   (*pbVar8 & 0x80) != 0)) {
                  (this->super_VideoBase).pixel_pointer_[0x237] =
                       (this->super_VideoBase).graphics_carry_;
                }
                else {
                  (this->super_VideoBase).pixel_pointer_[0x237] = '\0';
                }
              }
              else {
                (this->super_VideoBase).pixel_pointer_[0x237] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x236] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x235] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x234] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x233] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x232] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x231] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x230] = '\0';
              }
            }
            Outputs::CRT::CRT::output_data(&(this->super_VideoBase).crt_,0x238,0x238);
            (this->super_VideoBase).pixel_pointer_ = (uint8_t *)0x0;
          }
        }
      }
      else if (((this->super_VideoBase).column_ < 0x28) && (0x27 < blank_start)) {
        Outputs::CRT::CRT::output_blank(&(this->super_VideoBase).crt_,0x238);
      }
      if (((this->super_VideoBase).column_ < 0x31) && (0x30 < blank_start)) {
        Outputs::CRT::CRT::output_blank(&(this->super_VideoBase).crt_,0x76);
      }
      if (((this->super_VideoBase).column_ < 0x35) && (0x34 < blank_start)) {
        Outputs::CRT::CRT::output_sync(&(this->super_VideoBase).crt_,0x38);
      }
      m = VideoSwitches<Cycles>::graphics_mode((VideoSwitches<Cycles> *)this,0);
      bVar1 = is_text_mode(m);
      if (bVar1) {
        local_94[0] = 0x35;
        piVar4 = std::max<int>(local_94,&(this->super_VideoBase).column_);
        local_78 = *piVar4;
      }
      else {
        local_80 = 0x36;
        piVar4 = std::max<int>(&local_80,&(this->super_VideoBase).column_);
        colour_burst_end = *piVar4;
        local_88 = 0x39;
        piVar4 = std::min<int>(&local_88,&blank_start);
        iStack_84 = *piVar4;
        if (colour_burst_end < iStack_84) {
          local_89 = 0xc0;
          Outputs::CRT::CRT::output_colour_burst
                    (&(this->super_VideoBase).crt_,(iStack_84 - colour_burst_end) * 0xe,0xc0,false,
                     ')');
        }
        local_94[1] = 0x38;
        piVar4 = std::max<int>(local_94 + 1,&(this->super_VideoBase).column_);
        local_78 = *piVar4;
      }
      if (local_78 < blank_start) {
        Outputs::CRT::CRT::output_blank
                  (&(this->super_VideoBase).crt_,(blank_start - local_78) * 0xe);
      }
    }
    else {
      line_mode = 0x2d;
      piVar4 = std::max<int>((int *)&line_mode,&(this->super_VideoBase).column_);
      blank_end = *piVar4;
      piVar4 = std::min<int>(&int_cycles,&blank_start);
      character_row = *piVar4;
      if (blank_end < character_row) {
        if ((this->super_VideoBase).column_ < blank_end) {
          Outputs::CRT::CRT::output_sync
                    (&(this->super_VideoBase).crt_,
                     (blank_end - (this->super_VideoBase).column_) * 0xe);
        }
        Outputs::CRT::CRT::output_blank
                  (&(this->super_VideoBase).crt_,(character_row - blank_end) * 0xe);
        if (character_row < blank_start) {
          Outputs::CRT::CRT::output_sync
                    (&(this->super_VideoBase).crt_,(blank_start - character_row) * 0xe);
        }
      }
      else {
        Outputs::CRT::CRT::output_sync(&(this->super_VideoBase).crt_,ending_column * 0xe);
      }
    }
    local_28 = local_28 - ending_column;
    (this->super_VideoBase).column_ = ((this->super_VideoBase).column_ + ending_column) % 0x41;
    if ((this->super_VideoBase).column_ == 0) {
      (this->super_VideoBase).row_ = ((this->super_VideoBase).row_ + 1) % 0x106;
      VideoSwitches<Cycles>::did_end_line((VideoSwitches<Cycles> *)this);
      if ((local_35 & 1U) == 0) {
        Outputs::CRT::CRT::output_blank(&(this->super_VideoBase).crt_,2);
      }
      else {
        Outputs::CRT::CRT::output_sync(&(this->super_VideoBase).crt_,2);
      }
    }
  }
  return;
}

Assistant:

void advance(Cycles cycles) {
			/*
				Addressing scheme used throughout is that column 0 is the first column with pixels in it;
				row 0 is the first row with pixels in it.

				A frame is oriented around 65 cycles across, 262 lines down.
			*/
			constexpr int first_sync_line = 220;	// A complete guess. Information needed.
			constexpr int first_sync_column = 49;	// Also a guess.
			constexpr int sync_length = 4;			// One of the two likely candidates.

			int int_cycles = int(cycles.as_integral());
			while(int_cycles) {
				const int cycles_this_line = std::min(65 - column_, int_cycles);
				const int ending_column = column_ + cycles_this_line;
				const bool is_vertical_sync_line = (row_ >= first_sync_line && row_ < first_sync_line + 3);

				if(is_vertical_sync_line) {
					// In effect apply an XOR to HSYNC and VSYNC flags in order to include equalising
					// pulses (and hence keep hsync approximately where it should be during vsync).
					const int blank_start = std::max(first_sync_column - sync_length, column_);
					const int blank_end = std::min(first_sync_column, ending_column);
					if(blank_end > blank_start) {
						if(blank_start > column_) {
							crt_.output_sync((blank_start - column_) * 14);
						}
						crt_.output_blank((blank_end - blank_start) * 14);
						if(blank_end < ending_column) {
							crt_.output_sync((ending_column - blank_end) * 14);
						}
					} else {
						crt_.output_sync(cycles_this_line * 14);
					}
				} else {
					const GraphicsMode line_mode = graphics_mode(row_);

					// Determine whether there's any fetching to do. Fetching occurs during the first
					// 40 columns of rows prior to 192.
					if(row_ < 192 && column_ < 40) {
						const int character_row = row_ >> 3;
						const uint16_t row_address = uint16_t((character_row >> 3) * 40 + ((character_row&7) << 7));

						// Grab the memory contents that'll be needed momentarily.
						const int fetch_end = std::min(40, ending_column);
						uint16_t fetch_address;
						switch(line_mode) {
							default:
							case GraphicsMode::Text:
							case GraphicsMode::DoubleText:
							case GraphicsMode::LowRes:
							case GraphicsMode::FatLowRes:
							case GraphicsMode::DoubleLowRes: {
								const uint16_t text_address = uint16_t(((video_page()+1) * 0x400) + row_address);
								fetch_address = uint16_t(text_address + column_);
							} break;

							case GraphicsMode::HighRes:
							case GraphicsMode::DoubleHighRes:
								fetch_address = uint16_t(((video_page()+1) * 0x2000) + row_address + ((row_&7) << 10) + column_);
							break;
						}

						bus_handler_.perform_read(
							fetch_address,
							size_t(fetch_end - column_),
							&base_stream_[size_t(column_)],
							&auxiliary_stream_[size_t(column_)]);
					}

					if(row_ < 192) {
						// The pixel area is the first 40.5 columns; base contents
						// remain where they would naturally be but auxiliary
						// graphics appear to the left of that.
						if(!column_) {
							pixel_pointer_ = crt_.begin_data(568);
							graphics_carry_ = 0;
							was_double_ = true;
						}

						if(column_ < 40) {
							const int pixel_start = std::max(0, column_);
							const int pixel_end = std::min(40, ending_column);
							const int pixel_row = row_ & 7;

							const bool is_double = is_double_mode(line_mode);
							if(!is_double && was_double_ && pixel_pointer_) {
								pixel_pointer_[pixel_start*14 + 0] =
								pixel_pointer_[pixel_start*14 + 1] =
								pixel_pointer_[pixel_start*14 + 2] =
								pixel_pointer_[pixel_start*14 + 3] =
								pixel_pointer_[pixel_start*14 + 4] =
								pixel_pointer_[pixel_start*14 + 5] =
								pixel_pointer_[pixel_start*14 + 6] = 0;
							}
							was_double_ = is_double;

							if(pixel_pointer_) {
								switch(line_mode) {
									case GraphicsMode::Text:
										output_text(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::DoubleText:
										output_double_text(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::LowRes:
										output_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::FatLowRes:
										output_fat_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::DoubleLowRes:
										output_double_low_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::HighRes:
										output_high_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									case GraphicsMode::DoubleHighRes:
										output_double_high_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									default: break;
								}
							}

							if(pixel_end == 40) {
								if(pixel_pointer_) {
									if(was_double_) {
										pixel_pointer_[560] = pixel_pointer_[561] = pixel_pointer_[562] = pixel_pointer_[563] =
										pixel_pointer_[564] = pixel_pointer_[565] = pixel_pointer_[566] = pixel_pointer_[567] = 0;
									} else {
										if(line_mode == GraphicsMode::HighRes && base_stream_[39]&0x80)
											pixel_pointer_[567] = graphics_carry_;
										else
											pixel_pointer_[567] = 0;
									}
								}

								crt_.output_data(568, 568);
								pixel_pointer_ = nullptr;
							}
						}
					} else {
						if(column_ < 40 && ending_column >= 40) {
							crt_.output_blank(568);
						}
					}

					/*
						The left border, sync, right border pattern doesn't depend on whether
						there were pixels this row and is output as soon as it is known.
					*/

					if(column_ < first_sync_column && ending_column >= first_sync_column) {
						crt_.output_blank(first_sync_column*14 - 568);
					}

					if(column_ < (first_sync_column + sync_length) && ending_column >= (first_sync_column + sync_length)) {
						crt_.output_sync(sync_length*14);
					}

					int second_blank_start;
					// Colour burst is present on all lines of the display if graphics mode is enabled on the top
					// portion; therefore use the graphics mode on line 0 rather than the current line, to avoid
					// disabling it in mixed modes.
					if(!is_text_mode(graphics_mode(0))) {
						const int colour_burst_start = std::max(first_sync_column + sync_length + 1, column_);
						const int colour_burst_end = std::min(first_sync_column + sync_length + 4, ending_column);
						if(colour_burst_end > colour_burst_start) {
							// UGLY HACK AHOY!
							// The OpenGL scan target introduces a phase error of 1/8th of a wave. The Metal one does not.
							// Supply the real phase value if this is an Apple build.
							// TODO: eliminate UGLY HACK.
#if defined(__APPLE__) && !defined(IGNORE_APPLE)
							constexpr uint8_t phase = 224;
#else
							constexpr uint8_t phase = 192;
#endif

							crt_.output_colour_burst((colour_burst_end - colour_burst_start) * 14, phase);
						}

						second_blank_start = std::max(first_sync_column + sync_length + 3, column_);
					} else {
						second_blank_start = std::max(first_sync_column + sync_length, column_);
					}

					if(ending_column > second_blank_start) {
						crt_.output_blank((ending_column - second_blank_start) * 14);
					}
				}

				int_cycles -= cycles_this_line;
				column_ = (column_ + cycles_this_line) % 65;
				if(!column_) {
					row_ = (row_ + 1) % 262;
					did_end_line();

					// Add an extra half a colour cycle of blank; this isn't counted in the run_for
					// count explicitly but is promised. If this is a vertical sync line, output sync
					// instead of blank, taking that to be the default level.
					if(is_vertical_sync_line) {
						crt_.output_sync(2);
					} else {
						crt_.output_blank(2);
					}
				}
			}
		}